

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<NodeList<Node>_> * __thiscall
vector<NodeList<Node>_>::operator=(vector<NodeList<Node>_> *this,vector<NodeList<Node>_> *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  NodeList<Node> *pNVar5;
  ulong uVar6;
  NodeList<Node> *local_50;
  int local_28 [2];
  int i;
  vector<NodeList<Node>_> *local_18;
  vector<NodeList<Node>_> *other_local;
  vector<NodeList<Node>_> *this_local;
  
  this->_size = other->_size;
  this->_capacity = other->_capacity;
  uVar2 = (ulong)this->_capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  local_18 = other;
  other_local = this;
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  pNVar5 = (NodeList<Node> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_50 = pNVar5;
    do {
      NodeList<Node>::NodeList(local_50);
      local_50 = local_50 + 1;
    } while (local_50 != pNVar5 + uVar2);
  }
  this->vect = pNVar5;
  for (local_28[0] = 0; local_28[0] < this->_size; local_28[0] = local_28[0] + 1) {
    pNVar5 = operator[](local_18,local_28);
    NodeList<Node>::operator=(this->vect + local_28[0],pNVar5);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }